

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O0

void Exa_ManPrintSolution(Exa_Man_t_conflict *p,int fCompl)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int Val3;
  int Val2;
  int Val1;
  int iVarStart;
  int iVar;
  int k;
  int i;
  int fCompl_local;
  Exa_Man_t_conflict *p_local;
  
  printf("Realization of given %d-input function using %d two-input gates:\n",(ulong)(uint)p->nVars,
         (ulong)(uint)p->nNodes);
  iVar = p->nObjs;
  while (iVar = iVar + -1, p->nVars <= iVar) {
    iVar1 = (iVar - p->nVars) * 3;
    uVar2 = sat_solver_var_value(p->pSat,iVar1 + 1);
    uVar3 = sat_solver_var_value(p->pSat,iVar1 + 2);
    uVar4 = sat_solver_var_value(p->pSat,iVar1 + 3);
    if ((iVar == p->nObjs + -1) && (fCompl != 0)) {
      printf("%02d = 4\'b%d%d%d1(",(ulong)(uint)iVar,(ulong)((uVar4 != 0 ^ 0xffU) & 1),
             (ulong)((uVar3 != 0 ^ 0xffU) & 1),(ulong)((uVar2 != 0 ^ 0xffU) & 1));
    }
    else {
      printf("%02d = 4\'b%d%d%d0(",(ulong)(uint)iVar,(ulong)uVar4,(ulong)uVar3,(ulong)uVar2);
    }
    for (iVarStart = 1; -1 < iVarStart; iVarStart = iVarStart + -1) {
      uVar2 = Exa_ManFindFanin(p,iVar,iVarStart);
      if (((int)uVar2 < 0) || (p->nVars <= (int)uVar2)) {
        printf(" %02d",(ulong)uVar2);
      }
      else {
        printf(" %c",(ulong)(uVar2 + 0x61));
      }
    }
    printf(" )\n");
  }
  return;
}

Assistant:

void Exa_ManPrintSolution( Exa_Man_t * p, int fCompl )
{
    int i, k, iVar;
    printf( "Realization of given %d-input function using %d two-input gates:\n", p->nVars, p->nNodes );
//    for ( i = p->nVars + 2; i < p->nObjs; i++ )
    for ( i = p->nObjs - 1; i >= p->nVars; i-- )
    {
        int iVarStart = 1 + 3*(i - p->nVars);
        int Val1 = bmcg_sat_solver_read_cex_varvalue(p->pSat, iVarStart);
        int Val2 = bmcg_sat_solver_read_cex_varvalue(p->pSat, iVarStart+1);
        int Val3 = bmcg_sat_solver_read_cex_varvalue(p->pSat, iVarStart+2);
        if ( i == p->nObjs - 1 && fCompl )
            printf( "%02d = 4\'b%d%d%d1(", i, !Val3, !Val2, !Val1 );
        else
            printf( "%02d = 4\'b%d%d%d0(", i, Val3, Val2, Val1 );
        for ( k = 1; k >= 0; k-- )
        {
            iVar = Exa_ManFindFanin( p, i, k );
            if ( iVar >= 0 && iVar < p->nVars )
                printf( " %c", 'a'+iVar );
            else
                printf( " %02d", iVar );
        }
        printf( " )\n" );
    }
}